

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadTypeSection(BinaryReader *this,Offset section_size)

{
  BinaryReaderDelegate *pBVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  Result RVar5;
  Enum EVar6;
  reference pvVar7;
  reference out_value;
  size_type sVar8;
  TypeMut *pTVar9;
  Type *local_e8;
  Type *local_e0;
  TypeMut local_a0;
  TypeMut field;
  uint local_90;
  Index j_2;
  Enum local_84;
  Index num_fields;
  Type *result_types;
  Type *param_types;
  Enum local_68;
  Type local_64;
  uint local_60;
  Type result_type;
  Index j_1;
  Enum local_54;
  Index num_results;
  Type local_4c;
  uint local_48;
  Type param_type;
  Index j;
  Enum local_3c;
  Index num_params;
  uint local_34;
  Type form;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_signatures;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_signatures = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[9])(this->delegate_,section_size);
  bVar4 = Succeeded((Result)local_24);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    RVar5 = ReadCount(this,&local_28,"type count");
    bVar4 = Failed(RVar5);
    if (bVar4) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      form.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[10])();
      bVar4 = Succeeded((Result)form.enum_);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
          local_3c = (Enum)ReadType(this,(Type *)&num_params,"type form");
          bVar4 = Failed((Result)local_3c);
          if (bVar4) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          EVar6 = Type::operator_cast_to_Enum((Type *)&num_params);
          if (EVar6 == Array) {
            bVar4 = Features::gc_enabled(&this->options_->features);
            if (!bVar4) {
              PrintError(this,"invalid type form: array not allowed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar5 = ReadField(this,&local_a0);
            bVar4 = Failed(RVar5);
            if (bVar4) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar5.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd])
                                    (this->delegate_,(ulong)local_34,local_a0);
            bVar4 = Succeeded(RVar5);
            if (((bVar4 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnArrayType callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          else if (EVar6 == Struct) {
            bVar4 = Features::gc_enabled(&this->options_->features);
            if (!bVar4) {
              PrintError(this,"invalid type form: struct not allowed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar5 = ReadCount(this,&j_2,"field count");
            bVar4 = Failed(RVar5);
            if (bVar4) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::resize
                      (&this->fields_,(ulong)j_2);
            for (local_90 = 0; uVar3 = local_34, local_90 < j_2; local_90 = local_90 + 1) {
              out_value = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::operator[]
                                    (&this->fields_,(ulong)local_90);
              field._4_4_ = ReadField(this,out_value);
              bVar4 = Failed((Result)field._4_4_);
              if (bVar4) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            pBVar1 = this->delegate_;
            sVar8 = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::size(&this->fields_)
            ;
            pTVar9 = std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::data
                               (&this->fields_);
            field.type.enum_ =
                 (*pBVar1->_vptr_BinaryReaderDelegate[0xc])
                           (pBVar1,(ulong)uVar3,sVar8 & 0xffffffff,pTVar9);
            bVar4 = Succeeded((Result)field.type.enum_);
            if (((bVar4 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnStructType callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          else {
            if (EVar6 != Func) {
              EVar6 = Type::operator_cast_to_Enum((Type *)&num_params);
              pcVar2 = "\n\n";
              if (EVar6 < Any) {
                pcVar2 = "  -";
              }
              EVar6 = Type::operator_cast_to_Enum((Type *)&num_params);
              if (EVar6 < ~I64) {
                EVar6 = -EVar6;
              }
              PrintError(this,"unexpected type form (got %s%#x)",pcVar2 + 2,(ulong)(uint)EVar6);
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            param_type.enum_ = (Enum)ReadCount(this,&j,"function param count");
            bVar4 = Failed((Result)param_type.enum_);
            if (bVar4) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                      (&this->param_types_,(ulong)j);
            for (local_48 = 0; local_48 < j; local_48 = local_48 + 1) {
              num_results = (Index)ReadType(this,&local_4c,"function param type");
              bVar4 = Failed((Result)num_results);
              if (bVar4) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              local_54 = local_4c.enum_;
              bVar4 = IsConcreteType(this,local_4c);
              if (!bVar4) {
                EVar6 = Type::operator_cast_to_Enum(&local_4c);
                pcVar2 = "\n\n";
                if (EVar6 < Any) {
                  pcVar2 = "  -";
                }
                EVar6 = Type::operator_cast_to_Enum(&local_4c);
                if (EVar6 < ~I64) {
                  EVar6 = -EVar6;
                }
                PrintError(this,"expected valid param type (got %s%#x)",pcVar2 + 2,
                           (ulong)(uint)EVar6);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              pvVar7 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                                 (&this->param_types_,(ulong)local_48);
              pvVar7->enum_ = local_4c.enum_;
            }
            result_type.enum_ = (Enum)ReadCount(this,&j_1,"function result count");
            bVar4 = Failed((Result)result_type.enum_);
            if (bVar4) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                      (&this->result_types_,(ulong)j_1);
            for (local_60 = 0; local_60 < j_1; local_60 = local_60 + 1) {
              local_68 = (Enum)ReadType(this,&local_64,"function result type");
              bVar4 = Failed((Result)local_68);
              if (bVar4) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              param_types._4_4_ = local_64.enum_;
              bVar4 = IsConcreteType(this,local_64);
              if (!bVar4) {
                EVar6 = Type::operator_cast_to_Enum(&local_64);
                pcVar2 = "\n\n";
                if (EVar6 < Any) {
                  pcVar2 = "  -";
                }
                EVar6 = Type::operator_cast_to_Enum(&local_64);
                if (EVar6 < ~I64) {
                  EVar6 = -EVar6;
                }
                PrintError(this,"expected valid result type (got %s%#x)",pcVar2 + 2,
                           (ulong)(uint)EVar6);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              pvVar7 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                                 (&this->result_types_,(ulong)local_60);
              pvVar7->enum_ = local_64.enum_;
            }
            if (j == 0) {
              local_e0 = (Type *)0x0;
            }
            else {
              local_e0 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                   (&this->param_types_);
            }
            result_types = local_e0;
            if (j_1 == 0) {
              local_e8 = (Type *)0x0;
            }
            else {
              local_e8 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                   (&this->result_types_);
            }
            _num_fields = local_e8;
            local_84 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb])
                                 (this->delegate_,(ulong)local_34,(ulong)j,result_types,(ulong)j_1,
                                  local_e8);
            bVar4 = Succeeded((Result)local_84);
            if (((bVar4 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnFuncType callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
        }
        RVar5.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe])();
        bVar4 = Succeeded(RVar5);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndTypeSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnTypeCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTypeSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTypeSection(Offset section_size) {
  CALLBACK(BeginTypeSection, section_size);
  Index num_signatures;
  CHECK_RESULT(ReadCount(&num_signatures, "type count"));
  CALLBACK(OnTypeCount, num_signatures);

  for (Index i = 0; i < num_signatures; ++i) {
    Type form;
    CHECK_RESULT(ReadType(&form, "type form"));

    switch (form) {
      case Type::Func: {
        Index num_params;
        CHECK_RESULT(ReadCount(&num_params, "function param count"));

        param_types_.resize(num_params);

        for (Index j = 0; j < num_params; ++j) {
          Type param_type;
          CHECK_RESULT(ReadType(&param_type, "function param type"));
          ERROR_UNLESS(IsConcreteType(param_type),
                       "expected valid param type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(param_type));
          param_types_[j] = param_type;
        }

        Index num_results;
        CHECK_RESULT(ReadCount(&num_results, "function result count"));

        result_types_.resize(num_results);

        for (Index j = 0; j < num_results; ++j) {
          Type result_type;
          CHECK_RESULT(ReadType(&result_type, "function result type"));
          ERROR_UNLESS(IsConcreteType(result_type),
                       "expected valid result type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(result_type));
          result_types_[j] = result_type;
        }

        Type* param_types = num_params ? param_types_.data() : nullptr;
        Type* result_types = num_results ? result_types_.data() : nullptr;

        CALLBACK(OnFuncType, i, num_params, param_types, num_results,
                 result_types);
        break;
      }

      case Type::Struct: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: struct not allowed");
        Index num_fields;
        CHECK_RESULT(ReadCount(&num_fields, "field count"));

        fields_.resize(num_fields);
        for (Index j = 0; j < num_fields; ++j) {
          CHECK_RESULT(ReadField(&fields_[j]));
        }

        CALLBACK(OnStructType, i, fields_.size(), fields_.data());
        break;
      }

      case Type::Array: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: array not allowed");

        TypeMut field;
        CHECK_RESULT(ReadField(&field));
        CALLBACK(OnArrayType, i, field);
        break;
      };

      default:
        PrintError("unexpected type form (got " PRItypecode ")",
                   WABT_PRINTF_TYPE_CODE(form));
        return Result::Error;
    }
  }
  CALLBACK0(EndTypeSection);
  return Result::Ok;
}